

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O0

size_t tinyusdz::anon_unknown_0::_CompressIntegers<int>
                 (int *begin,size_t numInts,char *output,string *err)

{
  size_t sVar1;
  char *__p;
  pointer pcVar2;
  size_t encodedSize;
  unique_ptr<char[],_std::default_delete<char[]>_> encodeBuffer;
  string *err_local;
  char *output_local;
  size_t numInts_local;
  int *begin_local;
  
  encodeBuffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)err;
  sVar1 = _GetEncodedBufferSize<int>(numInts);
  __p = (char *)operator_new__(sVar1);
  ::std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            ((unique_ptr<char[],std::default_delete<char[]>> *)&encodedSize,__p);
  pcVar2 = ::std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)&encodedSize);
  sVar1 = _EncodeIntegers<int>(begin,numInts,pcVar2);
  pcVar2 = ::std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)&encodedSize);
  sVar1 = LZ4Compression::CompressToBuffer
                    (pcVar2,output,sVar1,
                     (string *)
                     encodeBuffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                     _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&encodedSize);
  return sVar1;
}

Assistant:

size_t
_CompressIntegers(Int const *begin, size_t numInts, char *output, std::string *err)
{
    // Working space.
    std::unique_ptr<char[]>
        encodeBuffer(new char[_GetEncodedBufferSize<Int>(numInts)]);
    
    // Encode first.
    size_t encodedSize = _EncodeIntegers(begin, numInts, encodeBuffer.get());

    // Then compress.
    return LZ4Compression::CompressToBuffer(
        encodeBuffer.get(), output, encodedSize, err);
}